

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.cpp
# Opt level: O0

void __thiscall Entity::spawn(Entity *this)

{
  value_type *__x;
  long in_RDI;
  int in_stack_00000014;
  float in_stack_00000018;
  float in_stack_0000001c;
  PowerUp *in_stack_00000020;
  PowerUp *p;
  list<Entity_*,_std::allocator<Entity_*>_> *in_stack_ffffffffffffffe0;
  
  if (-1 < *(int *)(in_RDI + 0x24)) {
    __x = (value_type *)operator_new(0x50);
    PowerUp::PowerUp(in_stack_00000020,in_stack_0000001c,in_stack_00000018,in_stack_00000014);
    std::__cxx11::list<Entity_*,_std::allocator<Entity_*>_>::push_back
              (in_stack_ffffffffffffffe0,__x);
  }
  return;
}

Assistant:

void Entity::spawn(void)
{
   if (powerup >= 0) {
      PowerUp *p = new PowerUp(x, y, powerup);
      new_entities.push_back(p);
   }
}